

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::num_suffix(sequence *__return_storage_ptr__,spec *s)

{
  pointer __p;
  anon_class_8_1_54a39813 graph;
  anon_class_8_1_54a39813 non_digit_graph;
  repeat_at_least local_110;
  anon_class_8_1_54a39813 local_f8;
  either local_f0;
  character local_d0;
  character local_c0;
  either local_b0;
  either local_90;
  sequence local_70;
  either local_50;
  anon_class_8_1_54a39813 local_30;
  __uniq_ptr_impl<toml::detail::either,_std::default_delete<toml::detail::either>_> local_28;
  
  local_c0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_c0.value_ = '_';
  local_f8.s = s;
  local_30.s = s;
  num_suffix::anon_class_8_1_54a39813::operator()(&local_50,&local_30);
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
  local_d0.value_ = '_';
  num_suffix::anon_class_8_1_54a39813::operator()(&local_90,&local_f8);
  sequence::sequence<toml::detail::character,toml::detail::either>(&local_70,&local_d0,&local_90);
  num_suffix::anon_class_8_1_54a39813::operator()(&local_b0,&local_f8);
  either::either<toml::detail::sequence,toml::detail::either>(&local_f0,&local_70,&local_b0);
  local_110.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00568a40;
  local_110.length_ = 0;
  local_110.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_110.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_00568990;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_f0.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_f0.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_110.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_f0.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>.
  super__Head_base<0UL,_toml::detail::either_*,_false>._M_head_impl =
       (tuple<toml::detail::either_*,_std::default_delete<toml::detail::either>_>)
       (_Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_28);
  sequence::sequence<toml::detail::character,toml::detail::either,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_c0,&local_50,&local_110);
  if (local_110.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_110.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_110.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f0.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_b0.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_90.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence num_suffix(const spec& s)
{
    const auto non_digit_graph = [&s]() {
        return either(
            alpha(s),
            non_ascii(s)
        );
    };
    const auto graph = [&s]() {
        return either(
            alpha(s),
            digit(s),
            non_ascii(s)
        );
    };

    return sequence(
            character(char_type('_')),
            non_digit_graph(),
            repeat_at_least(0,
                either(
                    sequence(character(char_type('_')), graph()),
                    graph()
                )
            )
        );
}